

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O1

QString * __thiscall
DelayImpEntryWrapper::getFieldName
          (QString *__return_storage_ptr__,DelayImpEntryWrapper *this,size_t fieldId)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  switch(fieldId) {
  case 0:
    goto LAB_00131ad0;
  case 1:
LAB_00131ad0:
    psVar1 = (storage_type *)0xa;
    break;
  case 2:
    psVar1 = (storage_type *)0xc;
    break;
  case 3:
    psVar1 = (storage_type *)0x3;
    break;
  case 4:
    psVar1 = (storage_type *)0xf;
    break;
  case 5:
    psVar1 = (storage_type *)0x8;
    break;
  case 6:
    goto LAB_00131af2;
  case 7:
LAB_00131af2:
    psVar1 = (storage_type *)0x9;
    break;
  default:
    (*(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString DelayImpEntryWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case ATTRS : return "Attributes";
        case NAME : return "Name Addr.";
        case MOD : return "ModuleHandle";
        case IAT : return "IAT";
        case INT : return "ImportNameTable";
        case BOUND_IAT : return "BoundIAT";
        case UNLOAD_IAT : return "UnloadIAT";
        case TIMESTAMP : return "Timestamp";
    }
    return getName();
}